

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

unsigned_long Js::JavascriptConversion::ToUInt64(Var aValue,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  unsigned_long uVar7;
  RecyclableObject *this;
  JavascriptTypedNumber<unsigned_long> *pJVar8;
  double T1;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00985e82;
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(aValue);
  if (bVar3) {
switchD_00985e55_caseD_3:
    iVar4 = TaggedInt::ToInt32(aValue);
LAB_00985d4e:
    uVar7 = (unsigned_long)iVar4;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
switchD_00985e55_caseD_4:
      T1 = JavascriptNumber::GetValue(aValue);
      uVar7 = NumberUtilities::TryToInt64(T1);
      return uVar7;
    }
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00985e82;
      *puVar6 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00985e82:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    switch(TVar1) {
    case TypeIds_FirstNumberType:
      goto switchD_00985e55_caseD_3;
    case TypeIds_Number:
      goto switchD_00985e55_caseD_4;
    case TypeIds_Int64Number:
      pJVar8 = (JavascriptTypedNumber<unsigned_long> *)
               UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      break;
    case TypeIds_LastNumberType:
      pJVar8 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      break;
    default:
      iVar4 = ToInt32_Full(aValue,scriptContext);
      goto LAB_00985d4e;
    }
    uVar7 = pJVar8->m_value;
  }
  return uVar7;
}

Assistant:

unsigned __int64 JavascriptConversion::ToUInt64(Var aValue, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Integer:
            {
                return (unsigned __int64)TaggedInt::ToInt32(aValue);
            }
        case TypeIds_Int64Number:
            {
            JavascriptInt64Number* int64Number = UnsafeVarTo<JavascriptInt64Number>(aValue);
            return (unsigned __int64)int64Number->GetValue();
            }
        case TypeIds_UInt64Number:
            {
            JavascriptUInt64Number* uint64Number = UnsafeVarTo<JavascriptUInt64Number>(aValue);
            return uint64Number->GetValue();
            }
        case TypeIds_Number:
            return static_cast<unsigned __int64>(JavascriptMath::TryToInt64(JavascriptNumber::GetValue(aValue)));
        default:
            return (unsigned __int64)JavascriptConversion::ToInt32_Full(aValue, scriptContext);
        }
    }